

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3Fts5HashScanEntry
               (Fts5Hash *pHash,char **pzTerm,int *pnTerm,u8 **ppDoclist,int *pnDoclist)

{
  int iVar1;
  long lVar2;
  Fts5HashEntry *in_RCX;
  Fts5HashEntry *in_RDX;
  Fts5Hash *in_RSI;
  long in_RDI;
  int *in_R8;
  int nTerm;
  char *zKey;
  Fts5HashEntry *p;
  
  lVar2 = *(long *)(in_RDI + 0x18);
  if (lVar2 == 0) {
    *(undefined8 *)in_RSI = 0;
    *(undefined4 *)&in_RDX->pHashNext = 0;
    in_RCX->pHashNext = (Fts5HashEntry *)0x0;
    *in_R8 = 0;
  }
  else {
    iVar1 = *(int *)(lVar2 + 0x1c);
    fts5HashAddPoslistSize(in_RSI,in_RDX,in_RCX);
    *(long *)in_RSI = lVar2 + 0x30;
    *(int *)&in_RDX->pHashNext = iVar1;
    in_RCX->pHashNext = (Fts5HashEntry *)(lVar2 + 0x30 + (long)iVar1);
    *in_R8 = *(int *)(lVar2 + 0x18) - (iVar1 + 0x30);
  }
  return;
}

Assistant:

static void sqlite3Fts5HashScanEntry(
  Fts5Hash *pHash,
  const char **pzTerm,            /* OUT: term (nul-terminated) */
  int *pnTerm,                    /* OUT: Size of term in bytes */
  const u8 **ppDoclist,           /* OUT: pointer to doclist */
  int *pnDoclist                  /* OUT: size of doclist in bytes */
){
  Fts5HashEntry *p;
  if( (p = pHash->pScan) ){
    char *zKey = fts5EntryKey(p);
    int nTerm = p->nKey;
    fts5HashAddPoslistSize(pHash, p, 0);
    *pzTerm = zKey;
    *pnTerm = nTerm;
    *ppDoclist = (const u8*)&zKey[nTerm];
    *pnDoclist = p->nData - (sizeof(Fts5HashEntry) + nTerm);
  }else{
    *pzTerm = 0;
    *pnTerm = 0;
    *ppDoclist = 0;
    *pnDoclist = 0;
  }
}